

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int64_t float128_to_int64_round_to_zero_s390x(float128 a,float_status *status)

{
  flag fVar1;
  int32_t iVar2;
  int iVar3;
  uint64_t uVar4;
  byte bVar5;
  ulong local_50;
  int64_t z;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t shiftCount;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  
  uVar4 = extractFloat128Frac1(a);
  aSig1 = extractFloat128Frac0(a);
  iVar2 = extractFloat128Exp(a);
  fVar1 = extractFloat128Sign(a);
  if (iVar2 != 0) {
    aSig1 = aSig1 | 0x1000000000000;
  }
  iVar3 = iVar2 + -0x402f;
  bVar5 = (byte)iVar3;
  if (iVar3 < 1) {
    if (iVar2 < 0x3fff) {
      if ((iVar2 != 0 || aSig1 != 0) || uVar4 != 0) {
        status->float_exception_flags = status->float_exception_flags | 0x20;
      }
      return 0;
    }
    local_50 = aSig1 >> (-bVar5 & 0x3f);
    if ((uVar4 != 0) || ((iVar3 != 0 && (aSig1 << (bVar5 & 0x3f) != 0)))) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
  }
  else {
    if (0x403d < iVar2) {
      if ((a.high == 0xc03e000000000000) && (uVar4 < 0x2000000000000)) {
        if (uVar4 != 0) {
          status->float_exception_flags = status->float_exception_flags | 0x20;
        }
      }
      else {
        float_raise_s390x('\x01',status);
        if ((fVar1 == '\0') || ((iVar2 == 0x7fff && ((aSig1 & 0xffffffffffff) != 0 || uVar4 != 0))))
        {
          return 0x7fffffffffffffff;
        }
      }
      return -0x8000000000000000;
    }
    local_50 = aSig1 << (bVar5 & 0x3f) | uVar4 >> (-bVar5 & 0x3f);
    if (uVar4 << (bVar5 & 0x3f) != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
  }
  if (fVar1 != '\0') {
    local_50 = -local_50;
  }
  return local_50;
}

Assistant:

int64_t float128_to_int64_round_to_zero(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1;
    int64_t z;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp ) aSig0 |= UINT64_C(0x0001000000000000);
    shiftCount = aExp - 0x402F;
    if ( 0 < shiftCount ) {
        if ( 0x403E <= aExp ) {
            aSig0 &= UINT64_C(0x0000FFFFFFFFFFFF);
            if (    ( a.high == UINT64_C(0xC03E000000000000) )
                 && ( aSig1 < UINT64_C(0x0002000000000000) ) ) {
                if (aSig1) {
                    status->float_exception_flags |= float_flag_inexact;
                }
            }
            else {
                float_raise(float_flag_invalid, status);
                if ( ! aSign || ( ( aExp == 0x7FFF ) && ( aSig0 | aSig1 ) ) ) {
                    return INT64_MAX;
                }
            }
            return INT64_MIN;
        }
        z = ( aSig0<<shiftCount ) | ( aSig1>>( ( - shiftCount ) & 63 ) );
        if ( (uint64_t) ( aSig1<<shiftCount ) ) {
            status->float_exception_flags |= float_flag_inexact;
        }
    }
    else {
        if ( aExp < 0x3FFF ) {
            if ( aExp | aSig0 | aSig1 ) {
                status->float_exception_flags |= float_flag_inexact;
            }
            return 0;
        }
        z = aSig0>>( - shiftCount );
        if (    aSig1
             || ( shiftCount && (uint64_t) ( aSig0<<( shiftCount & 63 ) ) ) ) {
            status->float_exception_flags |= float_flag_inexact;
        }
    }
    if ( aSign ) z = - z;
    return z;

}